

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSecureDelete(Btree *p,int newFlag)

{
  ushort uVar1;
  uint uVar2;
  
  if (p == (Btree *)0x0) {
    uVar2 = 0;
  }
  else {
    sqlite3BtreeEnter(p);
    uVar1 = p->pBt->btsFlags;
    uVar2 = (uint)uVar1;
    if (-1 < newFlag) {
      uVar2 = newFlag << 2 | uVar1 & 0xfffffff3;
      p->pBt->btsFlags = (u16)uVar2;
    }
    uVar2 = uVar2 >> 2 & 3;
    sqlite3BtreeLeave(p);
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSecureDelete(Btree *p, int newFlag){
  int b;
  if( p==0 ) return 0;
  sqlite3BtreeEnter(p);
  assert( BTS_OVERWRITE==BTS_SECURE_DELETE*2 );
  assert( BTS_FAST_SECURE==(BTS_OVERWRITE|BTS_SECURE_DELETE) );
  if( newFlag>=0 ){
    p->pBt->btsFlags &= ~BTS_FAST_SECURE;
    p->pBt->btsFlags |= BTS_SECURE_DELETE*newFlag;
  }
  b = (p->pBt->btsFlags & BTS_FAST_SECURE)/BTS_SECURE_DELETE;
  sqlite3BtreeLeave(p);
  return b;
}